

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

SiPair * __thiscall
kj::Vector<kj::_::(anonymous_namespace)::SiPair>::add<kj::_::(anonymous_namespace)::SiPair>
          (Vector<kj::_::(anonymous_namespace)::SiPair> *this,SiPair *params)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  SiPair *pSVar5;
  size_t sVar6;
  ulong uVar7;
  void *__dest;
  ulong capacity;
  size_t __n;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  
  lVar2 = *(long *)(this + 0x10);
  if (*(long *)(this + 8) == lVar2) {
    lVar3 = *(long *)this;
    capacity = 4;
    if (lVar2 != lVar3) {
      capacity = (lVar2 - lVar3 >> 3) * 0x5555555555555556;
    }
    uVar7 = (*(long *)(this + 8) - lVar3 >> 3) * -0x5555555555555555;
    if (capacity <= uVar7 && uVar7 - capacity != 0) {
      *(ulong *)(this + 8) = lVar3 + capacity * 0x18;
    }
    __dest = _::HeapArrayDisposer::allocateImpl
                       (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pvVar1 = (void *)((long)__dest + capacity * 0x18);
    puVar10 = &_::HeapArrayDisposer::instance;
    __n = *(long *)(this + 8) - (long)*(void **)this;
    pvVar8 = __dest;
    pvVar9 = pvVar1;
    if (__n != 0) {
      memcpy(__dest,*(void **)this,__n);
    }
    lVar2 = *(long *)this;
    if (lVar2 != 0) {
      lVar3 = *(long *)(this + 8);
      lVar4 = *(long *)(this + 0x10);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined8 *)(this + 0x10) = 0;
      (**(code **)**(undefined8 **)(this + 0x18))
                (*(undefined8 **)(this + 0x18),lVar2,0x18,(lVar3 - lVar2 >> 3) * -0x5555555555555555
                 ,(lVar4 - lVar2 >> 3) * -0x5555555555555555,0,pvVar8,(long)__dest + __n,pvVar9,
                 puVar10);
    }
    *(void **)this = __dest;
    *(size_t *)(this + 8) = (long)__dest + __n;
    *(void **)(this + 0x10) = pvVar1;
    *(undefined8 **)(this + 0x18) = &_::HeapArrayDisposer::instance;
  }
  puVar10 = *(undefined8 **)(this + 8);
  puVar10[2] = *(undefined8 *)&params->i;
  sVar6 = (params->str).content.size_;
  *puVar10 = (params->str).content.ptr;
  puVar10[1] = sVar6;
  pSVar5 = *(SiPair **)(this + 8);
  *(SiPair **)(this + 8) = pSVar5 + 1;
  return pSVar5;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }